

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

bool __thiscall
tlx::CmdlineParser::ArgumentSizeT::process(ArgumentSizeT *this,int *argc,char ***argv)

{
  ulonglong uVar1;
  unsigned_long uVar2;
  unsigned_long_long x;
  char *endptr;
  char ***argv_local;
  int *argc_local;
  ArgumentSizeT *this_local;
  
  if ((((*argc != 0) &&
       (endptr = (char *)argv, argv_local = (char ***)argc, argc_local = (int *)this,
       uVar1 = strtoull(**argv,(char **)&x,10), x != 0)) && (*(char *)x == '\0')) &&
     (uVar2 = std::numeric_limits<unsigned_long>::max(), uVar1 <= uVar2)) {
    *(int *)argv_local = *(int *)argv_local + -1;
    *(long *)endptr = *(long *)endptr + 8;
    *this->dest_ = uVar1;
    return true;
  }
  return false;
}

Assistant:

bool process(int& argc, const char* const*& argv) final { // NOLINT
        if (argc == 0)
            return false;
        char* endptr;
        unsigned long long x = strtoull(argv[0], &endptr, 10);
        if (endptr != nullptr && *endptr == 0 &&
            x <= std::numeric_limits<size_t>::max()) {
            --argc, ++argv;
            dest_ = x;
            return true;
        }
        else {
            return false;
        }
    }